

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzset_unlocked.c
# Opt level: O1

int zoneinit(state *sp,char *name)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  
  if ((sp == (state *)0x0) || ((char)sp->leapcnt != '\0')) {
    iVar3 = _PDCLIB_tzload((char *)sp,&_PDCLIB_lclmem,true);
    if ((iVar3 != 0 && sp != (state *)0x0) &&
       (((char)sp->leapcnt != ':' &&
        (_Var2 = _PDCLIB_tzparse((char *)sp,&_PDCLIB_lclmem,false), _Var2)))) {
      iVar3 = 0;
    }
    if (iVar3 == 0) {
      lVar7 = (long)_PDCLIB_lclmem.charcnt;
      if (0 < lVar7) {
        lVar8 = 0;
        do {
          pvVar5 = memchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789 :+-._",
                          (int)_PDCLIB_lclmem.chars[lVar8],0x45);
          if (pvVar5 == (void *)0x0) {
            _PDCLIB_lclmem.chars[lVar8] = '_';
          }
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
      if (0 < _PDCLIB_lclmem.typecnt) {
        piVar9 = &_PDCLIB_lclmem.ttis[0].desigidx;
        lVar7 = 0;
        do {
          iVar1 = *piVar9;
          sVar6 = strlen(_PDCLIB_lclmem.chars + iVar1);
          if ((0x10 < sVar6) &&
             (iVar4 = strcmp(_PDCLIB_lclmem.chars + iVar1,
                             "Local time zone must be set--see zic manual page"), iVar4 != 0)) {
            _PDCLIB_lclmem.chars[(long)iVar1 + 0x10] = '\0';
          }
          lVar7 = lVar7 + 1;
          piVar9 = piVar9 + 4;
        } while (lVar7 < _PDCLIB_lclmem.typecnt);
      }
    }
  }
  else {
    _PDCLIB_lclmem.leapcnt = 0;
    _PDCLIB_lclmem.timecnt = 0;
    _PDCLIB_lclmem.typecnt = 0;
    _PDCLIB_lclmem.charcnt = 0;
    _PDCLIB_lclmem.goback = false;
    _PDCLIB_lclmem.goahead = false;
    iVar3 = 0;
    _PDCLIB_init_ttinfo(_PDCLIB_lclmem.ttis,0,false,0);
    builtin_strncpy(_PDCLIB_lclmem.chars,"GMT",4);
    _PDCLIB_lclmem.defaulttype = 0;
  }
  return iVar3;
}

Assistant:

static int zoneinit( struct state * sp, char const * name )
{
    if (name && ! name[0])
    {
        /* User wants it fast rather than right. */
        sp->leapcnt = 0;        /* so, we're off a little */
        sp->timecnt = 0;
        sp->typecnt = 0;
        sp->charcnt = 0;
        sp->goback = sp->goahead = false;
        _PDCLIB_init_ttinfo( &sp->ttis[ 0 ], 0, false, 0 );
        strcpy( sp->chars, gmt );
        sp->defaulttype = 0;
        return 0;
    }
    else
    {
        int err = _PDCLIB_tzload( name, sp, true );

        if ( err != 0 && name && name[ 0 ] != ':' && _PDCLIB_tzparse( name, sp, false ) )
        {
            err = 0;
        }

        if ( err == 0 )
        {
            scrub_abbrs( sp );
        }

        return err;
    }
}